

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

_Bool lf_load_keyfile_helper(LoadFileStatus status,char **errptr)

{
  _Bool _Var1;
  int *piVar2;
  char *pcVar3;
  
  if (status == LF_OK) {
    _Var1 = true;
  }
  else {
    if (status == LF_TOO_BIG) {
      pcVar3 = "file is too large to be a key file";
    }
    else {
      if (status != LF_ERROR) {
        __assert_fail("false && \"bad status value in lf_load_keyfile_helper\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                      0x75,"_Bool lf_load_keyfile_helper(LoadFileStatus, const char **)");
      }
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
    }
    if (errptr != (char **)0x0) {
      *errptr = pcVar3;
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static inline bool lf_load_keyfile_helper(LoadFileStatus status,
                                          const char **errptr)
{
    const char *error;
    switch (status) {
      case LF_OK:
        return true;
      case LF_TOO_BIG:
        error = "file is too large to be a key file";
        break;
      case LF_ERROR:
        error = strerror(errno);
        break;
      default:
        unreachable("bad status value in lf_load_keyfile_helper");
    }
    if (errptr)
        *errptr = error;
    return false;
}